

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int GetResponseDescriptorRPLIDAR
              (RPLIDAR *pRPLIDAR,int *pDataResponseLength,int *pSendMode,int *pDataType)

{
  int iVar1;
  double dVar2;
  int local_4a4;
  undefined1 local_4a0 [8];
  CHRONO chrono;
  uchar *ptr;
  int local_448;
  int nbBytesDiscarded;
  int nbBytesToRequest;
  int res;
  int recvbuflen;
  int BytesReceived;
  uchar recvbuf [1024];
  int *pDataType_local;
  int *pSendMode_local;
  int *pDataResponseLength_local;
  RPLIDAR *pRPLIDAR_local;
  
  res = 0;
  nbBytesToRequest = 0;
  nbBytesDiscarded = 1;
  local_448 = 0;
  ptr._4_4_ = 0;
  chrono.Suspended = 0;
  chrono._68_4_ = 0;
  StartChrono((CHRONO *)local_4a0);
  memset(&recvbuflen,0,0x400);
  nbBytesToRequest = 0x3ff;
  res = 0;
  local_448 = 7;
  iVar1 = ReadAllRS232Port(&pRPLIDAR->RS232Port,(uint8 *)&recvbuflen,7);
  if (iVar1 == 0) {
    res = local_448 + res;
    do {
      nbBytesDiscarded =
           FindResponseDescriptorRPLIDAR
                     ((uchar *)&recvbuflen,res,pDataResponseLength,pSendMode,pDataType,&local_448,
                      (uchar **)&chrono.Suspended,(int *)((long)&ptr + 4));
      if (nbBytesDiscarded == 0) {
        if (0 < (res - ptr._4_4_) + -7) {
          printf(
                "Warning getting data from a RPLIDAR : Unexpected data after a response descriptor. \n"
                );
        }
        return 0;
      }
      if (nbBytesDiscarded == 1) {
        if (ptr._4_4_ < 8) {
          local_4a4 = ptr._4_4_;
        }
        else {
          local_4a4 = 7;
        }
        local_448 = local_4a4;
      }
      memmove(&recvbuflen,(void *)((long)&recvbuflen + (long)ptr._4_4_),(long)(res - ptr._4_4_));
      res = res - ptr._4_4_;
      if (nbBytesToRequest < res + local_448) {
        printf("Error reading data from a RPLIDAR : Invalid data. \n");
        return 4;
      }
      iVar1 = ReadAllRS232Port(&pRPLIDAR->RS232Port,(uint8 *)((long)&recvbuflen + (long)res),
                               local_448);
      if (iVar1 != 0) {
        printf("Error reading data from a RPLIDAR. \n");
        return 1;
      }
      res = local_448 + res;
      dVar2 = GetTimeElapsedChronoQuick((CHRONO *)local_4a0);
    } while (dVar2 <= 4.0);
    printf("Error reading data from a RPLIDAR : Response descriptor timeout. \n");
    pRPLIDAR_local._4_4_ = 2;
  }
  else {
    printf("Error reading data from a RPLIDAR. \n");
    pRPLIDAR_local._4_4_ = 1;
  }
  return pRPLIDAR_local._4_4_;
}

Assistant:

inline int GetResponseDescriptorRPLIDAR(RPLIDAR* pRPLIDAR, int* pDataResponseLength, int* pSendMode, int* pDataType)
{
	unsigned char recvbuf[MAX_NB_BYTES_RPLIDAR];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	unsigned char* ptr = NULL;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_RPLIDAR-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired response descriptor...

	nbBytesToRequest = NB_BYTES_RESPONSE_DESCRIPTOR_RPLIDAR;
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a RPLIDAR. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += nbBytesToRequest;
	
	for (;;)
	{
		res = FindResponseDescriptorRPLIDAR(recvbuf, BytesReceived, pDataResponseLength, pSendMode, pDataType, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(NB_BYTES_RESPONSE_DESCRIPTOR_RPLIDAR, nbBytesDiscarded);
		}	
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a RPLIDAR : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a RPLIDAR. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_RPLIDAR)
		{
			printf("Error reading data from a RPLIDAR : Response descriptor timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-NB_BYTES_RESPONSE_DESCRIPTOR_RPLIDAR > 0)
	{
		printf("Warning getting data from a RPLIDAR : Unexpected data after a response descriptor. \n");
	}

	return EXIT_SUCCESS;
}